

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

void __thiscall Infector::AnyShared<GBVS>::setPtr(AnyShared<GBVS> *this,void *p)

{
  exception *ex;
  GBVS *tp;
  void *p_local;
  AnyShared<GBVS> *this_local;
  
  std::__shared_ptr<GBVS,_(__gnu_cxx::_Lock_policy)2>::reset<GBVS>
            (&(this->ist).super___shared_ptr<GBVS,_(__gnu_cxx::_Lock_policy)2>,(GBVS *)p);
  resolve_multiple_cast<GBVS>(this,(GBVS *)p);
  return;
}

Assistant:

virtual void setPtr(void * p) override {
            T* tp = reinterpret_cast<T*>(p);
            try{
                ist.reset(tp);
                resolve_multiple_cast<T,Bases...>(tp);
            }catch(std::exception & ex){
                multi_solver.clear();
                throw ex;
            }catch(...){
                multi_solver.clear();
                throw ExUnkownException();
            }
        }